

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_split.hpp
# Opt level: O2

basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *
make_word<wchar_t,std::__cxx11::wstring>
          (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
           *__return_storage_ptr__,size_t length,wchar_t delim)

{
  wchar_t local_3c;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  local_3c = delim;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&local_38,&local_3c,&local_38);
  make_word<wchar_t,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_nullptr>
            (__return_storage_ptr__,&local_38,length);
  std::__cxx11::wstring::~wstring((wstring *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

ResultT make_word(size_t length = 8, T delim = default_delim<T>) {
	return make_word<T, ResultT>(std::basic_string<T>{ delim }, length);
}